

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O3

int proxy_start(proxy_handle *ph)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  plVar1 = (long *)ph->priv;
  uVar7 = 0;
  if (0 < (int)plVar1[0x107]) {
    lVar5 = 0;
    uVar7 = 0;
    do {
      iVar2 = proxy_conn_start((proxy_conn_handle *)(*plVar1 + lVar5));
      if (iVar2 < 0) {
        pcVar4 = strerror(-iVar2);
        proxy_log(ph,LOG_LEVEL_FATAL,"Failed to start proxy connection #%d (%d): %s\n",
                  uVar7 & 0xffffffff,(ulong)(uint)-iVar2,pcVar4);
        goto LAB_00104fc7;
      }
      uVar7 = uVar7 + 1;
      lVar5 = lVar5 + 0x48;
    } while ((long)uVar7 < (long)(int)plVar1[0x107]);
    if ((int)plVar1[0x107] < 1) {
      uVar7 = 0;
    }
    else {
      lVar5 = 0x20;
      uVar7 = 0;
      do {
        iVar2 = worker_start((worker_handle *)(plVar1[0x103] + lVar5));
        if (iVar2 < 0) {
          pcVar4 = strerror(-iVar2);
          proxy_log(ph,LOG_LEVEL_FATAL,"Failed to start proxy worker #%d (%d): %s\n",
                    uVar7 & 0xffffffff,(ulong)(uint)-iVar2,pcVar4);
          goto LAB_00104f8b;
        }
        uVar7 = uVar7 + 1;
        lVar5 = lVar5 + 0x50;
      } while ((long)uVar7 < (long)(int)plVar1[0x107]);
    }
  }
  mutex_lock((mutex_handle *)(plVar1 + 0x10e));
  *(int *)((long)plVar1 + 0x83c) = (int)plVar1[0x107];
  mutex_unlock((mutex_handle *)(plVar1 + 0x10e));
  proxy_update_registration(ph);
  iVar3 = registration_service_start((registration_service_handle *)(plVar1 + 0x111),&ph->conf);
  iVar2 = 0;
  if (iVar3 < 0) {
    pcVar4 = strerror(-iVar3);
    proxy_log(ph,LOG_LEVEL_FATAL,"Failed to start registration service (%d): %s\n",
              (ulong)(uint)-iVar3,pcVar4);
    iVar2 = iVar3;
LAB_00104f8b:
    if (0 < (int)uVar7) {
      uVar6 = (uVar7 & 0xffffffff) + 1;
      lVar5 = (uVar7 & 0xffffffff) * 0x50 + -0x30;
      do {
        worker_join((worker_handle *)(plVar1[0x103] + lVar5));
        uVar6 = uVar6 - 1;
        lVar5 = lVar5 + -0x50;
      } while (1 < uVar6);
    }
    uVar7 = (ulong)*(uint *)(plVar1 + 0x107);
LAB_00104fc7:
    if (0 < (int)uVar7) {
      uVar6 = (uVar7 & 0xffffffff) + 1;
      lVar5 = (uVar7 & 0xffffffff) * 0x48;
      do {
        lVar5 = lVar5 + -0x48;
        proxy_conn_stop((proxy_conn_handle *)(*plVar1 + lVar5));
        uVar6 = uVar6 - 1;
      } while (1 < uVar6);
    }
  }
  return iVar2;
}

Assistant:

int proxy_start(struct proxy_handle *ph)
{
	struct proxy_priv *priv = ph->priv;
	int ret;
	int i;

	for (i = 0; i < priv->num_clients; i++) {
		ret = proxy_conn_start(&priv->clients[i]);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to start proxy connection #%d (%d): %s\n",
				  i, -ret, strerror(-ret));
			goto proxy_start_exit_early;
		}
	}

	for (i = 0; i < priv->num_clients; i++) {
		ret = worker_start(&priv->client_workers[i].worker);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to start proxy worker #%d (%d): %s\n",
				  i, -ret, strerror(-ret));
			goto proxy_start_exit;
		}
	}

	mutex_lock(&priv->usable_clients_mutex);
	priv->usable_clients = priv->num_clients;
	mutex_unlock(&priv->usable_clients_mutex);

	proxy_update_registration(ph);
	ret = registration_service_start(&priv->reg_service, &ph->conf);
	if (ret < 0) {
		proxy_log(ph, LOG_LEVEL_FATAL,
			  "Failed to start registration service (%d): %s\n",
			  -ret, strerror(-ret));
		goto proxy_start_exit;
	}

	return 0;

proxy_start_exit:
	for (i--; i >= 0; i--)
		worker_join(&priv->client_workers[i].worker);

	i = priv->num_clients;

proxy_start_exit_early:
	for (i--; i >= 0; i--)
		proxy_conn_stop(&priv->clients[i]);

	return ret;
}